

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O2

bool Assimp::FBX::anon_unknown_3::ReadScope
               (TokenList *output_tokens,char *input,char **cursor,char *end,bool is64bits)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  bool is64bits_00;
  byte *end_00;
  int iVar10;
  undefined7 in_register_00000081;
  uint uVar11;
  byte *pbVar12;
  ulong uVar13;
  char *pcVar14;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *this;
  char *sb;
  char *local_a8;
  char **local_a0;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *local_98;
  uint64_t local_90;
  char *se;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int local_68;
  uint32_t local_64;
  ulong local_60;
  char *local_58;
  byte *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  iVar10 = (int)CONCAT71(in_register_00000081,is64bits);
  local_98 = (vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
             output_tokens;
  if (iVar10 == 0) {
    uVar5 = ReadWord(input,cursor,end);
    local_60 = (ulong)uVar5;
  }
  else {
    local_60 = ReadDoubleWord(input,cursor,end);
  }
  if (local_60 != 0) {
    if ((ulong)((long)end - (long)input) < local_60) {
      std::__cxx11::string::string((string *)&sb,"block offset is out of range",(allocator *)&se);
      TokenizeError((string *)&sb,(long)*cursor - (long)input);
    }
    if (local_60 < (ulong)((long)*cursor - (long)input)) {
      std::__cxx11::string::string
                ((string *)&sb,"block offset is negative out of range",(allocator *)&se);
      TokenizeError((string *)&sb,(long)*cursor - (long)input);
    }
    local_68 = iVar10;
    if (is64bits) {
      local_a8 = (char *)ReadDoubleWord(input,cursor,end);
      uVar7 = ReadDoubleWord(input,cursor,end);
    }
    else {
      uVar5 = ReadWord(input,cursor,end);
      local_a8 = (char *)(ulong)uVar5;
      uVar5 = ReadWord(input,cursor,end);
      uVar7 = (uint64_t)uVar5;
    }
    uVar11 = 0;
    ReadString(&local_40,&local_38,input,cursor,end,false,false);
    sb = (char *)operator_new(0x28);
    this = local_98;
    pcVar14 = *cursor;
    *(char **)sb = local_40;
    *(char **)(sb + 8) = local_38;
    sb[0x10] = '\x05';
    sb[0x11] = '\0';
    sb[0x12] = '\0';
    sb[0x13] = '\0';
    *(long *)(sb + 0x18) = (long)pcVar14 - (long)input;
    sb[0x20] = -1;
    sb[0x21] = -1;
    sb[0x22] = -1;
    sb[0x23] = -1;
    std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
    emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)&sb);
    local_58 = *cursor;
    end_00 = (byte *)(local_58 + uVar7);
    local_48 = (long)local_a8 - 1;
    local_a0 = cursor;
    local_90 = uVar7;
    local_50 = end_00;
    while( true ) {
      uVar3 = local_60;
      pbVar2 = (byte *)*cursor;
      if (local_a8 <= (ulong)uVar11) break;
      if (pbVar2 == end_00) {
        std::__cxx11::string::string
                  ((string *)&sb,"cannot ReadData, out of bounds reading length",(allocator *)&se);
        TokenizeError((string *)&sb,(long)*cursor - (long)input);
      }
      bVar1 = *pbVar2;
      *cursor = (char *)(pbVar2 + 1);
      local_78._M_local_buf[0] = bVar1;
      switch(bVar1) {
      case 0x43:
        pbVar12 = pbVar2 + 2;
        break;
      case 0x44:
      case 0x4c:
        pbVar12 = pbVar2 + 9;
        break;
      case 0x45:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
switchD_0017a242_caseD_45:
        se = (char *)&local_78;
        local_80 = 1;
        local_78._M_local_buf[1] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sb,
                       "cannot ReadData, unexpected type code: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&se);
        TokenizeError((string *)&sb,(long)*cursor - (long)input);
      case 0x46:
      case 0x49:
        pbVar12 = pbVar2 + 5;
        break;
      case 0x52:
        uVar5 = ReadWord(input,cursor,(char *)end_00);
        pbVar12 = (byte *)(*cursor + uVar5);
        break;
      case 0x53:
        ReadString(&sb,&se,input,cursor,(char *)end_00,true,true);
        pbVar12 = (byte *)*cursor;
        goto LAB_0017a36d;
      default:
        uVar4 = bVar1 - 0x59;
        if (0x13 < uVar4) goto switchD_0017a242_caseD_45;
        if ((0x92c00U >> (uVar4 & 0x1f) & 1) != 0) {
          local_64 = ReadWord(input,local_a0,(char *)end_00);
          uVar5 = ReadWord(input,local_a0,(char *)end_00);
          cursor = local_a0;
          uVar6 = ReadWord(input,local_a0,(char *)end_00);
          if (uVar5 != 1) {
            if (uVar5 != 0) {
              std::__cxx11::string::string
                        ((string *)&sb,"cannot ReadData, unknown encoding",(allocator *)&se);
              TokenizeError((string *)&sb,(long)*local_a0 - (long)input);
            }
            iVar10 = 0;
            if ((byte)(bVar1 + 0x9d) < 10) {
              iVar10 = *(int *)(&DAT_001d5560 + (ulong)(byte)(bVar1 + 0x9d) * 4);
            }
            if (iVar10 * local_64 != uVar6) {
              std::__cxx11::string::string
                        ((string *)&sb,
                         "cannot ReadData, calculated data stride differs from what the file claims"
                         ,(allocator *)&se);
              TokenizeError((string *)&sb,(long)*local_a0 - (long)input);
            }
          }
          pbVar12 = (byte *)(*cursor + uVar6);
          *cursor = (char *)pbVar12;
          end_00 = local_50;
          this = local_98;
          goto LAB_0017a36d;
        }
        if (uVar4 == 0) {
          pbVar12 = pbVar2 + 3;
          break;
        }
        if (uVar4 != 9) goto switchD_0017a242_caseD_45;
        *cursor = (char *)end_00;
        pbVar12 = end_00;
        goto LAB_0017a376;
      }
      *cursor = (char *)pbVar12;
LAB_0017a36d:
      if (end_00 < pbVar12) {
        se = (char *)&local_78;
        local_80 = 1;
        local_78._M_local_buf[1] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sb,
                       "cannot ReadData, the remaining size is too small for the data type: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&se);
        TokenizeError((string *)&sb,(long)*cursor - (long)input);
      }
LAB_0017a376:
      sb = (char *)operator_new(0x28);
      *(byte **)sb = pbVar2;
      *(byte **)(sb + 8) = pbVar12;
      sb[0x10] = '\x02';
      sb[0x11] = '\0';
      sb[0x12] = '\0';
      sb[0x13] = '\0';
      *(long *)(sb + 0x18) = (long)pbVar12 - (long)input;
      sb[0x20] = -1;
      sb[0x21] = -1;
      sb[0x22] = -1;
      sb[0x23] = -1;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(this,(Token **)&sb);
      if (local_48 != uVar11) {
        sb = (char *)operator_new(0x28);
        pcVar14 = *cursor;
        *(char **)sb = pcVar14;
        *(char **)((long)sb + 8) = pcVar14 + 1;
        *(undefined4 *)((long)sb + 0x10) = 4;
        *(long *)((long)sb + 0x18) = (long)pcVar14 - (long)input;
        *(undefined4 *)((long)sb + 0x20) = 0xffffffff;
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        emplace_back<Assimp::FBX::Token_const*>(this,(Token **)&sb);
      }
      uVar11 = uVar11 + 1;
    }
    if ((long)pbVar2 - (long)local_58 != local_90) {
      std::__cxx11::string::string
                ((string *)&sb,"property length not reached, something is wrong",(allocator *)&se);
      TokenizeError((string *)&sb,(long)*cursor - (long)input);
    }
    is64bits_00 = SUB41(local_68,0);
    local_a8 = (char *)0xfffffffffffffff3;
    if (is64bits_00 != false) {
      local_a8 = (char *)0xffffffffffffffe7;
    }
    uVar9 = 0xd;
    if (is64bits_00 != false) {
      uVar9 = 0x19;
    }
    uVar13 = (long)pbVar2 - (long)input;
    if (uVar13 < local_60) {
      local_90 = uVar9;
      if (local_60 - uVar13 < uVar9) {
        std::__cxx11::string::string
                  ((string *)&sb,"insufficient padding bytes at block end",(allocator *)&se);
        TokenizeError((string *)&sb,(long)*cursor - (long)input);
      }
      sb = (char *)operator_new(0x28);
      *(byte **)sb = pbVar2;
      *(byte **)(sb + 8) = pbVar2 + 1;
      sb[0x10] = '\0';
      sb[0x11] = '\0';
      sb[0x12] = '\0';
      sb[0x13] = '\0';
      *(ulong *)(sb + 0x18) = uVar13;
      sb[0x20] = -1;
      sb[0x21] = -1;
      sb[0x22] = -1;
      sb[0x23] = -1;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(this,(Token **)&sb);
      uVar9 = uVar3 - local_90;
      local_a8 = local_a8 + (long)(input + uVar3);
      while( true ) {
        pcVar14 = *cursor;
        if (uVar9 <= (ulong)((long)pcVar14 - (long)input)) break;
        ReadScope((TokenList *)local_98,input,cursor,local_a8,is64bits_00);
      }
      sb = (char *)operator_new(0x28);
      *(char **)sb = pcVar14;
      *(char **)((long)sb + 8) = pcVar14 + 1;
      *(undefined4 *)((long)sb + 0x10) = 1;
      *(long *)((long)sb + 0x18) = (long)pcVar14 - (long)input;
      *(undefined4 *)((long)sb + 0x20) = 0xffffffff;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)&sb);
      lVar8 = 0;
      while ((uint)lVar8 < (uint)local_90) {
        pcVar14 = *cursor + lVar8;
        lVar8 = lVar8 + 1;
        if (*pcVar14 != '\0') {
          std::__cxx11::string::string
                    ((string *)&sb,
                     "failed to read nested block sentinel, expected all bytes to be 0",
                     (allocator *)&se);
          TokenizeError((string *)&sb,(long)*cursor - (long)input);
        }
      }
      pcVar14 = *cursor + local_90;
      *cursor = pcVar14;
      uVar13 = (long)pcVar14 - (long)input;
    }
    if (uVar13 != local_60) {
      std::__cxx11::string::string
                ((string *)&sb,"scope length not reached, something is wrong",(allocator *)&se);
      TokenizeError((string *)&sb,(long)*cursor - (long)input);
    }
  }
  return local_60 != 0;
}

Assistant:

bool ReadScope(TokenList& output_tokens, const char* input, const char*& cursor, const char* end, bool const is64bits)
{
    // the first word contains the offset at which this block ends
	const uint64_t end_offset = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // we may get 0 if reading reached the end of the file -
    // fbx files have a mysterious extra footer which I don't know
    // how to extract any information from, but at least it always
    // starts with a 0.
    if(!end_offset) {
        return false;
    }

    if(end_offset > Offset(input, end)) {
        TokenizeError("block offset is out of range",input, cursor);
    }
    else if(end_offset < Offset(input, cursor)) {
        TokenizeError("block offset is negative out of range",input, cursor);
    }

    // the second data word contains the number of properties in the scope
	const uint64_t prop_count = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // the third data word contains the length of the property list
	const uint64_t prop_length = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // now comes the name of the scope/key
    const char* sbeg, *send;
    ReadString(sbeg, send, input, cursor, end);

    output_tokens.push_back(new_Token(sbeg, send, TokenType_KEY, Offset(input, cursor) ));

    // now come the individual properties
    const char* begin_cursor = cursor;
    for (unsigned int i = 0; i < prop_count; ++i) {
        ReadData(sbeg, send, input, cursor, begin_cursor + prop_length);

        output_tokens.push_back(new_Token(sbeg, send, TokenType_DATA, Offset(input, cursor) ));

        if(i != prop_count-1) {
            output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_COMMA, Offset(input, cursor) ));
        }
    }

    if (Offset(begin_cursor, cursor) != prop_length) {
        TokenizeError("property length not reached, something is wrong",input, cursor);
    }

    // at the end of each nested block, there is a NUL record to indicate
    // that the sub-scope exists (i.e. to distinguish between P: and P : {})
    // this NUL record is 13 bytes long on 32 bit version and 25 bytes long on 64 bit.
	const size_t sentinel_block_length = is64bits ? (sizeof(uint64_t)* 3 + 1) : (sizeof(uint32_t)* 3 + 1);

    if (Offset(input, cursor) < end_offset) {
        if (end_offset - Offset(input, cursor) < sentinel_block_length) {
            TokenizeError("insufficient padding bytes at block end",input, cursor);
        }

        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_OPEN_BRACKET, Offset(input, cursor) ));

        // XXX this is vulnerable to stack overflowing ..
        while(Offset(input, cursor) < end_offset - sentinel_block_length) {
			ReadScope(output_tokens, input, cursor, input + end_offset - sentinel_block_length, is64bits);
        }
        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_CLOSE_BRACKET, Offset(input, cursor) ));

        for (unsigned int i = 0; i < sentinel_block_length; ++i) {
            if(cursor[i] != '\0') {
                TokenizeError("failed to read nested block sentinel, expected all bytes to be 0",input, cursor);
            }
        }
        cursor += sentinel_block_length;
    }

    if (Offset(input, cursor) != end_offset) {
        TokenizeError("scope length not reached, something is wrong",input, cursor);
    }

    return true;
}